

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoCompress.c
# Opt level: O3

void PutBits(INT32 Number,UINT32 Value)

{
  UINT8 *pUVar1;
  byte *pbVar2;
  byte *pbVar3;
  
  pUVar1 = mDstUpperLimit;
  pbVar2 = mDst;
  if (mBitCount <= Number) {
    do {
      Number = Number - mBitCount;
      pbVar3 = pbVar2;
      if (pbVar2 < pUVar1) {
        pbVar3 = pbVar2 + 1;
        mDst = pbVar3;
        *pbVar2 = (byte)mSubBitBuf | (byte)(Value >> ((byte)Number & 0x1f));
      }
      mCompSize = mCompSize + 1;
      mSubBitBuf = 0;
      mBitCount = 8;
      pbVar2 = pbVar3;
    } while (7 < Number);
    mSubBitBuf = 0;
  }
  mBitCount = mBitCount - Number;
  mSubBitBuf = Value << ((byte)mBitCount & 0x1f) | mSubBitBuf;
  return;
}

Assistant:

STATIC 
VOID 
PutBits (
  IN INT32 n, 
  IN UINT32 x
  )
/*++

Routine Description:

  Outputs rightmost n bits of x

Argments:

  n   - the rightmost n bits of the data is used
  x   - the data 

Returns: (VOID)

--*/
{
  UINT8 Temp;  
  
  if (n < mBitCount) {
    mSubBitBuf |= x << (mBitCount -= n);
  } else {
      
    Temp = (UINT8)(mSubBitBuf | (x >> (n -= mBitCount)));
    if (mDst < mDstUpperLimit) {
      *mDst++ = Temp;
    }
    mCompSize++;

    if (n < UINT8_BIT) {
      mSubBitBuf = x << (mBitCount = UINT8_BIT - n);
    } else {
        
      Temp = (UINT8)(x >> (n - UINT8_BIT));
      if (mDst < mDstUpperLimit) {
        *mDst++ = Temp;
      }
      mCompSize++;
      
      mSubBitBuf = x << (mBitCount = 2 * UINT8_BIT - n);
    }
  }
}